

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O3

int bcf_hdr_combine(bcf_hdr_t *dst,bcf_hdr_t *src)

{
  uint uVar1;
  uint uVar2;
  bcf_hrec_t **ppbVar3;
  char **ppcVar4;
  uint *puVar5;
  uint *puVar6;
  char *__s2;
  long lVar7;
  char cVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  bcf_hrec_t *pbVar13;
  bcf_hrec_t *pbVar14;
  byte bVar15;
  char *pcVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  int local_90;
  int local_8c;
  
  if (src->nhrec < 1) {
    local_90 = 0;
  }
  else {
    uVar1 = dst->nhrec;
    lVar19 = 0;
    local_8c = 0;
    local_90 = 0;
    do {
      pbVar13 = src->hrec[lVar19];
      iVar9 = pbVar13->type;
      if (iVar9 == 4) {
        uVar10 = bcf_hrec_find_key(pbVar13,"ID");
        if ((-1 < (int)uVar10) &&
           (pbVar14 = bcf_hdr_get_hrec(dst,4,"ID",pbVar13->vals[uVar10],pbVar13->key),
           pbVar14 == (bcf_hrec_t *)0x0)) {
          pbVar13 = bcf_hrec_dup(pbVar13);
          iVar9 = bcf_hdr_add_hrec(dst,pbVar13);
          local_8c = local_8c + iVar9;
        }
      }
      else if ((iVar9 == 5) && (pbVar13->value != (char *)0x0)) {
        if (0 < (int)uVar1) {
          ppbVar3 = dst->hrec;
          uVar21 = 0;
          do {
            if ((ppbVar3[uVar21]->type == 5) &&
               (iVar9 = strcmp(pbVar13->key,ppbVar3[uVar21]->key), iVar9 == 0)) goto LAB_00121d88;
            uVar21 = uVar21 + 1;
          } while (uVar1 != uVar21);
        }
        pbVar13 = bcf_hrec_dup(pbVar13);
        iVar9 = bcf_hdr_add_hrec(dst,pbVar13);
        local_8c = local_8c + iVar9;
      }
      else {
        uVar10 = bcf_hrec_find_key(pbVar13,"ID");
        if ((int)uVar10 < 0) {
          __assert_fail("j>=0",
                        "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                        ,0x8c4,"int bcf_hdr_combine(bcf_hdr_t *, const bcf_hdr_t *)");
        }
        ppcVar4 = pbVar13->vals;
        pbVar14 = bcf_hdr_get_hrec(dst,iVar9,"ID",ppcVar4[uVar10],(char *)0x0);
        if (pbVar14 == (bcf_hrec_t *)0x0) {
          pbVar13 = bcf_hrec_dup(pbVar13);
          iVar9 = bcf_hdr_add_hrec(dst,pbVar13);
          local_8c = local_8c + iVar9;
        }
        else if (iVar9 - 1U < 2) {
          puVar5 = (uint *)src->dict[0];
          puVar6 = (uint *)dst->dict[0];
          __s2 = *ppcVar4;
          uVar10 = *puVar5;
          uVar21 = 0;
          if (uVar10 != 0) {
            uVar20 = (uint)*__s2;
            if (*__s2 == '\0') {
              uVar20 = 0;
            }
            else {
              cVar8 = __s2[1];
              if (cVar8 != '\0') {
                pcVar16 = __s2 + 2;
                do {
                  uVar20 = (int)cVar8 + uVar20 * 0x1f;
                  cVar8 = *pcVar16;
                  pcVar16 = pcVar16 + 1;
                } while (cVar8 != '\0');
              }
            }
            uVar20 = uVar20 & uVar10 - 1;
            lVar7 = *(long *)(puVar5 + 4);
            iVar9 = 1;
            uVar17 = uVar20;
            do {
              uVar2 = *(uint *)(lVar7 + (ulong)(uVar17 >> 4) * 4);
              bVar15 = (char)uVar17 * '\x02' & 0x1e;
              uVar11 = uVar2 >> bVar15;
              if (((uVar11 & 2) != 0) ||
                 (((uVar11 & 1) == 0 &&
                  (iVar12 = strcmp(*(char **)(*(long *)(puVar5 + 6) + (ulong)uVar17 * 8),__s2),
                  iVar12 == 0)))) {
                if ((uVar2 >> bVar15 & 3) == 0) {
                  uVar10 = uVar17;
                }
                break;
              }
              uVar17 = uVar17 + iVar9 & uVar10 - 1;
              iVar9 = iVar9 + 1;
            } while (uVar17 != uVar20);
            uVar21 = (ulong)uVar10;
          }
          uVar18 = 0;
          uVar10 = *puVar6;
          if (uVar10 != 0) {
            uVar20 = (uint)*__s2;
            if (*__s2 == '\0') {
              uVar20 = 0;
            }
            else {
              cVar8 = __s2[1];
              if (cVar8 != '\0') {
                pcVar16 = __s2 + 2;
                do {
                  uVar20 = (int)cVar8 + uVar20 * 0x1f;
                  cVar8 = *pcVar16;
                  pcVar16 = pcVar16 + 1;
                } while (cVar8 != '\0');
              }
            }
            uVar20 = uVar20 & uVar10 - 1;
            lVar7 = *(long *)(puVar6 + 4);
            iVar9 = 1;
            uVar17 = uVar20;
            do {
              uVar2 = *(uint *)(lVar7 + (ulong)(uVar17 >> 4) * 4);
              bVar15 = (char)uVar17 * '\x02' & 0x1e;
              uVar11 = uVar2 >> bVar15;
              if (((uVar11 & 2) != 0) ||
                 (((uVar11 & 1) == 0 &&
                  (iVar12 = strcmp(*(char **)(*(long *)(puVar6 + 6) + (ulong)uVar17 * 8),__s2),
                  iVar12 == 0)))) {
                if ((uVar2 >> bVar15 & 3) == 0) {
                  uVar10 = uVar17;
                }
                break;
              }
              uVar17 = uVar17 + iVar9 & uVar10 - 1;
              iVar9 = iVar9 + 1;
            } while (uVar17 != uVar20);
            uVar18 = (ulong)uVar10;
          }
          uVar10 = *(uint *)(*(long *)(puVar6 + 8) + uVar18 * 0x30 + (long)pbVar14->type * 4) ^
                   *(uint *)(*(long *)(puVar5 + 8) + uVar21 * 0x30 + (long)pbVar14->type * 4);
          if ((uVar10 & 0xf00) != 0) {
            fprintf(_stderr,
                    "Warning: trying to combine \"%s\" tag definitions of different lengths\n",__s2)
            ;
            uVar10 = *(uint *)(uVar18 * 0x30 + *(long *)(puVar6 + 8) + (long)pbVar14->type * 4) ^
                     *(uint *)(uVar21 * 0x30 + *(long *)(puVar5 + 8) + (long)pbVar14->type * 4);
            local_90 = 1;
          }
          if ((uVar10 & 0xf0) != 0) {
            bcf_hdr_combine_cold_1();
            local_90 = 1;
          }
        }
      }
LAB_00121d88:
      lVar19 = lVar19 + 1;
    } while (lVar19 < src->nhrec);
    if (local_8c != 0) {
      bcf_hdr_sync(dst);
    }
  }
  return local_90;
}

Assistant:

int bcf_hdr_combine(bcf_hdr_t *dst, const bcf_hdr_t *src)
{
    int i, ndst_ori = dst->nhrec, need_sync = 0, ret = 0;
    for (i=0; i<src->nhrec; i++)
    {
        if ( src->hrec[i]->type==BCF_HL_GEN && src->hrec[i]->value )
        {
            int j;
            for (j=0; j<ndst_ori; j++)
            {
                if ( dst->hrec[j]->type!=BCF_HL_GEN ) continue;

                // Checking only the key part of generic lines, otherwise
                // the VCFs are too verbose. Should we perhaps add a flag
                // to bcf_hdr_combine() and make this optional?
                if ( !strcmp(src->hrec[i]->key,dst->hrec[j]->key) ) break;
            }
            if ( j>=ndst_ori )
                need_sync += bcf_hdr_add_hrec(dst, bcf_hrec_dup(src->hrec[i]));
        }
        else if ( src->hrec[i]->type==BCF_HL_STR )
        {
            // NB: we are ignoring fields without ID
            int j = bcf_hrec_find_key(src->hrec[i],"ID");
            if ( j>=0 )
            {
                bcf_hrec_t *rec = bcf_hdr_get_hrec(dst, src->hrec[i]->type, "ID", src->hrec[i]->vals[j], src->hrec[i]->key);
                if ( !rec )
                    need_sync += bcf_hdr_add_hrec(dst, bcf_hrec_dup(src->hrec[i]));
            }
        }
        else
        {
            int j = bcf_hrec_find_key(src->hrec[i],"ID");
            assert( j>=0 ); // this should always be true for valid VCFs

            bcf_hrec_t *rec = bcf_hdr_get_hrec(dst, src->hrec[i]->type, "ID", src->hrec[i]->vals[j], NULL);
            if ( !rec )
                need_sync += bcf_hdr_add_hrec(dst, bcf_hrec_dup(src->hrec[i]));
            else if ( src->hrec[i]->type==BCF_HL_INFO || src->hrec[i]->type==BCF_HL_FMT )
            {
                // Check that both records are of the same type. The bcf_hdr_id2length
                // macro cannot be used here because dst header is not synced yet.
                vdict_t *d_src = (vdict_t*)src->dict[BCF_DT_ID];
                vdict_t *d_dst = (vdict_t*)dst->dict[BCF_DT_ID];
                khint_t k_src  = kh_get(vdict, d_src, src->hrec[i]->vals[0]);
                khint_t k_dst  = kh_get(vdict, d_dst, src->hrec[i]->vals[0]);
                if ( (kh_val(d_src,k_src).info[rec->type]>>8 & 0xf) != (kh_val(d_dst,k_dst).info[rec->type]>>8 & 0xf) )
                {
                    fprintf(stderr,"Warning: trying to combine \"%s\" tag definitions of different lengths\n", src->hrec[i]->vals[0]);
                    ret |= 1;
                }
                if ( (kh_val(d_src,k_src).info[rec->type]>>4 & 0xf) != (kh_val(d_dst,k_dst).info[rec->type]>>4 & 0xf) )
                {
                    fprintf(stderr,"Warning: trying to combine \"%s\" tag definitions of different types\n", src->hrec[i]->vals[0]);
                    ret |= 1;
                }
            }
        }
    }
    if ( need_sync ) bcf_hdr_sync(dst);
    return ret;
}